

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

OpCodeAsmJs __thiscall
Wasm::WasmBytecodeGenerator::GetReturnOp(WasmBytecodeGenerator *this,WasmType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WasmCompilationException *this_00;
  OpCodeAsmJs OVar4;
  
  switch(type) {
  case FirstLocalType:
    OVar4 = Return_Int;
    break;
  case I64:
    OVar4 = Return_Long;
    break;
  case F32:
    OVar4 = Return_Flt;
    break;
  case F64:
    OVar4 = Return_Db;
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    OVar4 = Simd128_Return_F4;
    break;
  default:
switchD_00f2269f_caseD_6:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_00,L"Unknown return type %u",type);
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  case Any:
    OVar4 = Return_Int;
    if (this->isUnreachable == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x736,"(IsUnreachable())","IsUnreachable()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      if ((this->isUnreachable & 1U) == 0) goto switchD_00f2269f_caseD_6;
    }
  }
  return OVar4;
}

Assistant:

Js::OpCodeAsmJs WasmBytecodeGenerator::GetReturnOp(WasmTypes::WasmType type)
{
    Js::OpCodeAsmJs retOp = Js::OpCodeAsmJs::Nop;
    switch (type)
    {
    case WasmTypes::F32:
        retOp = Js::OpCodeAsmJs::Return_Flt;
        break;
    case WasmTypes::F64:
        retOp = Js::OpCodeAsmJs::Return_Db;
        break;
    case WasmTypes::I32:
        retOp = Js::OpCodeAsmJs::Return_Int;
        break;
    case WasmTypes::I64:
        retOp = Js::OpCodeAsmJs::Return_Long;
        break;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
        Simd::EnsureSimdIsEnabled();
        retOp = Js::OpCodeAsmJs::Simd128_Return_F4;
        break;
#endif
    case WasmTypes::Any:
        // In unreachable mode load the any type like an int since we won't actually emit the load
        Assert(IsUnreachable());
        if (IsUnreachable())
        {
            return Js::OpCodeAsmJs::Return_Int;
        }
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Unknown return type %u"), type);
    }
    return retOp;
}